

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::basisSolveInterface
          (Highs *this,vector<double,_std::allocator<double>_> *rhs,double *solution_vector,
          HighsInt *solution_num_nz,HighsInt *solution_indices,bool transpose)

{
  double dVar1;
  uint size_;
  int iVar2;
  pointer pdVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  HEkk *this_00;
  ulong uVar7;
  HVector solve_vector;
  HVectorBase<double> local_e0;
  
  size_ = (this->model_).lp_.num_row_;
  if (size_ != 0) {
    this_00 = &this->ekk_instance_;
    HEkk::setNlaPointersForLpAndScale(this_00,&(this->model_).lp_);
    local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    HVectorBase<double>::setup(&local_e0,size_);
    HVectorBase<double>::clear(&local_e0);
    pdVar3 = (rhs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    uVar7 = 0;
    if (0 < (int)size_) {
      uVar7 = (ulong)size_;
    }
    local_e0.count = 0;
    for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      dVar1 = pdVar3[uVar5];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        lVar6 = (long)local_e0.count;
        local_e0.count = local_e0.count + 1;
        local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar6] = (int)uVar5;
        local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5] = dVar1;
      }
    }
    if (transpose) {
      HEkk::btran(this_00,&local_e0,1.0);
    }
    else {
      HEkk::ftran(this_00,&local_e0,1.0);
    }
    if (solution_indices == (HighsInt *)0x0) {
      if ((int)size_ < local_e0.count) {
        for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
          solution_vector[uVar5] =
               local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5];
        }
      }
      else {
        for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
          solution_vector[uVar5] = 0.0;
        }
        uVar7 = 0;
        uVar5 = (ulong)(uint)local_e0.count;
        if (local_e0.count < 1) {
          uVar5 = uVar7;
        }
        for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
          solution_vector
          [local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar7]] =
               local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start
               [local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7]];
        }
      }
    }
    else if ((int)size_ < local_e0.count) {
      piVar4 = (int *)0x0;
      for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        solution_vector[uVar5] = 0.0;
        dVar1 = local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5];
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          solution_vector[uVar5] = dVar1;
          iVar2 = *piVar4;
          piVar4 = piVar4 + 1;
          solution_indices[iVar2] = (HighsInt)uVar5;
        }
      }
    }
    else {
      for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        solution_vector[uVar5] = 0.0;
      }
      uVar5 = 0;
      uVar7 = 0;
      if (0 < local_e0.count) {
        uVar7 = (ulong)(uint)local_e0.count;
      }
      for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        iVar2 = local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5];
        solution_vector[iVar2] =
             local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar2];
        solution_indices[uVar5] = iVar2;
      }
      *solution_num_nz = local_e0.count;
    }
    HVectorBase<double>::~HVectorBase(&local_e0);
  }
  return kOk;
}

Assistant:

HighsStatus Highs::basisSolveInterface(const vector<double>& rhs,
                                       double* solution_vector,
                                       HighsInt* solution_num_nz,
                                       HighsInt* solution_indices,
                                       bool transpose) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsLp& lp = model_.lp_;
  HighsInt num_row = lp.num_row_;
  // For an LP with no rows the solution is vacuous
  if (num_row == 0) return return_status;
  // EKK must have an INVERT, but simplex NLA may need the pointer to
  // its LP to be refreshed so that it can use its scale factors
  assert(ekk_instance_.status_.has_invert);
  // Reset the simplex NLA LP and scale pointers for the unscaled LP
  ekk_instance_.setNlaPointersForLpAndScale(lp);
  assert(!lp.is_moved_);
  // Set up solve vector with suitably scaled RHS
  HVector solve_vector;
  solve_vector.setup(num_row);
  solve_vector.clear();
  HighsInt rhs_num_nz = 0;
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    if (rhs[iRow]) {
      solve_vector.index[rhs_num_nz++] = iRow;
      solve_vector.array[iRow] = rhs[iRow];
    }
  }
  solve_vector.count = rhs_num_nz;
  //
  // Note that solve_vector.count is just used to determine whether
  // hyper-sparse solves should be used. The indices of the nonzeros
  // in the solution are always accumulated. There's no switch (such
  // as setting solve_vector.count = num_row+1) to not do this.
  //
  // Get expected_density from analysis during simplex solve.
  const double expected_density = 1;
  if (transpose) {
    ekk_instance_.btran(solve_vector, expected_density);
  } else {
    ekk_instance_.ftran(solve_vector, expected_density);
  }
  // Extract the solution
  if (solution_indices == NULL) {
    // Nonzeros in the solution not required
    if (solve_vector.count > num_row) {
      // Solution nonzeros not known
      for (HighsInt iRow = 0; iRow < num_row; iRow++) {
        solution_vector[iRow] = solve_vector.array[iRow];
      }
    } else {
      // Solution nonzeros are known
      for (HighsInt iRow = 0; iRow < num_row; iRow++) solution_vector[iRow] = 0;
      for (HighsInt iX = 0; iX < solve_vector.count; iX++) {
        HighsInt iRow = solve_vector.index[iX];
        solution_vector[iRow] = solve_vector.array[iRow];
      }
    }
  } else {
    // Nonzeros in the solution are required
    if (solve_vector.count > num_row) {
      // Solution nonzeros not known
      solution_num_nz = 0;
      for (HighsInt iRow = 0; iRow < num_row; iRow++) {
        solution_vector[iRow] = 0;
        if (solve_vector.array[iRow]) {
          solution_vector[iRow] = solve_vector.array[iRow];
          solution_indices[*solution_num_nz++] = iRow;
        }
      }
    } else {
      // Solution nonzeros are known
      for (HighsInt iRow = 0; iRow < num_row; iRow++) solution_vector[iRow] = 0;
      for (HighsInt iX = 0; iX < solve_vector.count; iX++) {
        HighsInt iRow = solve_vector.index[iX];
        solution_vector[iRow] = solve_vector.array[iRow];
        solution_indices[iX] = iRow;
      }
      *solution_num_nz = solve_vector.count;
    }
  }
  return HighsStatus::kOk;
}